

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm.hpp
# Opt level: O0

void remora::kernels::
     gemm<remora::dense_matrix_adaptor<double,remora::row_major,remora::continuous_dense_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<double_const,remora::column_major,remora::continuous_dense_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<double_const,remora::column_major,remora::continuous_dense_tag,remora::cpu_tag>>
               (matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::column_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
                *e1,matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::column_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
                    *e2,matrix_expression<remora::dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
                        *m,value_type alpha)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined8 in_XMM0_Qa;
  
  bindings::
  gemm<remora::dense_matrix_adaptor<double_const,remora::column_major,remora::continuous_dense_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<double_const,remora::column_major,remora::continuous_dense_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<double,remora::row_major,remora::continuous_dense_tag,remora::cpu_tag>,remora::column_major,remora::column_major>
            (in_XMM0_Qa,in_RDI,in_RSI,in_RDX);
  return;
}

Assistant:

void gemm(
	matrix_expression<E1, cpu_tag> const& e1,
	matrix_expression<E2, cpu_tag> const& e2,
	matrix_expression<M, cpu_tag>& m,
	typename M::value_type alpha
) {
	REMORA_SIZE_CHECK(m().size1() == e1().size1());
	REMORA_SIZE_CHECK(m().size2() == e2().size2());
	REMORA_SIZE_CHECK(e1().size2() == e2().size1());

	typedef typename M::orientation ResultOrientation;
	typedef typename E1::orientation E1Orientation;
	typedef typename E2::orientation E2Orientation;
	typedef typename E1::evaluation_category::tag E1Tag;
	typedef typename E2::evaluation_category::tag E2Tag;

	bindings::gemm(e1, e2, m ,alpha,
		ResultOrientation(), E1Orientation(), E2Orientation(),
		E1Tag(),E2Tag()
	);
}